

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

int kmp_get_stacksize_(void)

{
  if (__kmp_init_serial == 0) {
    __kmp_serial_initialize();
  }
  return (int)__kmp_stksize;
}

Assistant:

int FTN_STDCALL FTN_GET_STACKSIZE(void) {
#ifdef KMP_STUB
  return __kmps_get_stacksize();
#else
  if (!__kmp_init_serial) {
    __kmp_serial_initialize();
  }
  return (int)__kmp_stksize;
#endif
}